

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O1

Gia_Man_t * Shr_ManFree(Shr_Man_t *p)

{
  Gia_Man_t **p_00;
  Gia_Man_t *pGVar1;
  int *__ptr;
  Vec_Wrd_t *pVVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  Gia_Man_t *pGVar5;
  
  p_00 = &p->pNew;
  Gia_ManHashStop(p->pNew);
  pGVar1 = p->pNew;
  if (pGVar1->vLevels != (Vec_Int_t *)0x0) {
    __ptr = pGVar1->vLevels->pArray;
    if (__ptr != (int *)0x0) {
      free(__ptr);
      pGVar1->vLevels->pArray = (int *)0x0;
    }
    if (pGVar1->vLevels != (Vec_Int_t *)0x0) {
      free(pGVar1->vLevels);
      pGVar1->vLevels = (Vec_Int_t *)0x0;
    }
  }
  iVar4 = Gia_ManHasDangling(*p_00);
  if (iVar4 != 0) {
    pGVar1 = *p_00;
    pGVar5 = Gia_ManCleanup(pGVar1);
    *p_00 = pGVar5;
    if (~(pGVar5->vCos->nSize + pGVar5->vCis->nSize) + pGVar5->nObjs !=
        ~(pGVar1->vCos->nSize + pGVar1->vCis->nSize) + pGVar1->nObjs) {
      printf("Node reduction after sweep %6d -> %6d.\n");
    }
    Gia_ManStop(pGVar1);
  }
  Gia_ManSetRegNum(p->pNew,p->pGia->nRegs);
  pGVar1 = p->pNew;
  p->pNew = (Gia_Man_t *)0x0;
  Rsb_ManFree(p->pManRsb);
  Bdc_ManFree(p->pManDec);
  Gia_ManStopP(p_00);
  pVVar2 = p->vFanMem;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar3 = p->vObj2Fan;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vDivs;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vPrio;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar2 = p->vTruths;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar2 = p->vDivTruths;
  if (pVVar2->pArray != (word *)0x0) {
    free(pVVar2->pArray);
    pVVar2->pArray = (word *)0x0;
  }
  if (pVVar2 != (Vec_Wrd_t *)0x0) {
    free(pVVar2);
  }
  pVVar3 = p->vDivResub;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  pVVar3 = p->vLeaves;
  if (pVVar3->pArray != (int *)0x0) {
    free(pVVar3->pArray);
    pVVar3->pArray = (int *)0x0;
  }
  if (pVVar3 != (Vec_Int_t *)0x0) {
    free(pVVar3);
  }
  free(p);
  return pGVar1;
}

Assistant:

Gia_Man_t * Shr_ManFree( Shr_Man_t * p )
{
    // prepare the manager
    Gia_Man_t * pTemp;
    Gia_ManHashStop( p->pNew );
    Vec_IntFreeP( &p->pNew->vLevels );
    if ( Gia_ManHasDangling(p->pNew) )
    {
        p->pNew = Gia_ManCleanup( pTemp = p->pNew );
        if ( Gia_ManAndNum(p->pNew) != Gia_ManAndNum(pTemp) )
            printf( "Node reduction after sweep %6d -> %6d.\n", Gia_ManAndNum(pTemp), Gia_ManAndNum(p->pNew) );
        Gia_ManStop( pTemp );
    }
    Gia_ManSetRegNum( p->pNew, Gia_ManRegNum(p->pGia) );
    pTemp = p->pNew; p->pNew = NULL;
    // free data structures
    Rsb_ManFree( p->pManRsb );
    Bdc_ManFree( p->pManDec );
    Gia_ManStopP( &p->pNew );
    Vec_WrdFree( p->vFanMem );
    Vec_IntFree( p->vObj2Fan );
    Vec_IntFree( p->vDivs );
    Vec_IntFree( p->vPrio );
    Vec_WrdFree( p->vTruths );
    Vec_WrdFree( p->vDivTruths );
    Vec_IntFree( p->vDivResub );
    Vec_IntFree( p->vLeaves );
    ABC_FREE( p );
    return pTemp;
}